

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void print_node(c2m_ctx_t c2m_ctx,FILE *f,node_t_conflict n,int indent,int attr_p)

{
  node_code_t nVar1;
  void *pvVar2;
  code *pcVar3;
  node_t pnVar4;
  code *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  pos_t pVar10;
  
  fprintf((FILE *)f,"%6u: ",(ulong)n->uid);
  iVar9 = indent;
  if (0 < indent) {
    do {
      fputc(0x20,(FILE *)f);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  if (n == &err_struct) {
    fwrite("<error>\n",8,1,(FILE *)f);
    return;
  }
  if (0x80 < (ulong)n->code) {
switchD_0017718e_default:
    abort();
  }
  fprintf((FILE *)f,"%s (",&DAT_001be3e4 + *(int *)(&DAT_001be3e4 + (ulong)n->code * 4));
  pVar10 = get_node_pos(c2m_ctx,n);
  if (-1 < pVar10.lno) {
    fprintf((FILE *)f,"%s:%d",pVar10.fname);
  }
  fputc(0x29,(FILE *)f);
  nVar1 = n->code;
  switch(nVar1) {
  case N_IGNORE:
    goto switchD_0017718e_caseD_0;
  case N_I:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %lld";
    goto LAB_0017755f;
  case N_L:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %lldl";
    goto LAB_0017755f;
  case N_LL:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %lldll";
    goto LAB_0017755f;
  case N_U:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %lluu";
    goto LAB_0017755f;
  case N_UL:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %lluul";
    goto LAB_0017755f;
  case N_ULL:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %lluull";
    goto LAB_0017755f;
  case N_F:
    pcVar7 = (char *)(double)(n->u).f;
    uVar6 = 0x18;
    goto LAB_00177580;
  case N_D:
    pcVar7 = (n->u).s.s;
    uVar6 = 0x35;
LAB_00177580:
    fprintf((FILE *)f," %.*g",pcVar7,uVar6);
    goto LAB_00177587;
  case N_LD:
    fprintf((FILE *)f," %.*Lg",0x40);
    goto LAB_00177587;
  case N_CH:
  case N_CH16:
  case N_CH32:
    pcVar7 = "U";
    if (nVar1 == N_CH16) {
      pcVar7 = "u";
    }
    pcVar8 = "";
    if (nVar1 != N_CH) {
      pcVar8 = pcVar7;
    }
    fprintf((FILE *)f," %s\'",pcVar8);
    print_char(f,(long)(n->u).ch);
    iVar9 = 0x27;
    goto LAB_001772cb;
  case N_STR:
  case N_STR16:
  case N_STR32:
    pcVar7 = "U";
    if (nVar1 == N_STR16) {
      pcVar7 = "u";
    }
    pcVar8 = "";
    if (nVar1 != N_STR) {
      pcVar8 = pcVar7;
    }
    fprintf((FILE *)f," %s\"",pcVar8);
    pcVar5 = print_chars32;
    if (n->code == N_STR16) {
      pcVar5 = print_chars16;
    }
    pcVar3 = print_chars;
    if (n->code != N_STR) {
      pcVar3 = pcVar5;
    }
    (*pcVar3)(f,(n->u).s.s,(n->u).s.len);
    iVar9 = 0x22;
LAB_001772cb:
    fputc(iVar9,(FILE *)f);
    goto LAB_00177587;
  case N_ID:
    pcVar7 = (n->u).s.s;
    pcVar8 = " %s";
LAB_0017755f:
    fprintf((FILE *)f,pcVar8,pcVar7);
LAB_00177587:
    if ((attr_p != 0) && ((expr_conflict *)n->attr != (expr_conflict *)0x0)) {
      print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
    }
switchD_0017718e_caseD_0:
    fputc(10,(FILE *)f);
    return;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_STMTEXPR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_LABEL_ADDR:
    if ((attr_p != 0) && ((expr_conflict *)n->attr != (expr_conflict *)0x0)) {
      print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
    }
    break;
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
  case N_ATTR:
    break;
  case N_SWITCH:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      print_type(c2m_ctx,f,(type *)n->attr);
    }
    break;
  case N_FOR:
  case N_BLOCK:
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
switchD_0017718e_caseD_48:
    if (attr_p == 0) {
LAB_001774a4:
      fputc(10,(FILE *)f);
    }
    else {
      if ((nVar1 & ~N_I) == N_STRUCT) {
        pnVar4 = (n->u).ops.head;
        if ((pnVar4 != (node_t)0x0) && ((pnVar4->op_link).next != (node_t)0x0)) {
          if (pnVar4 != (node_t)0x0) {
            pnVar4 = (pnVar4->op_link).next;
          }
          if (pnVar4->code != N_IGNORE) goto LAB_00177484;
        }
        goto LAB_001774a4;
      }
LAB_00177484:
      if (nVar1 == N_MODULE) {
        fwrite(": the top scope",0xf,1,(FILE *)f);
      }
      else if (n->attr != (void *)0x0) {
        fprintf((FILE *)f,": higher scope node %u",
                (ulong)*(uint *)(*(long *)((long)n->attr + 0x20) + 4));
      }
    }
    if ((n->code & ~N_I) != N_STRUCT) {
      if ((attr_p != 0) && (pvVar2 = n->attr, pvVar2 != (void *)0x0)) {
        fprintf((FILE *)f,", size = %llu, offset = %llu\n",*(undefined8 *)((long)pvVar2 + 8),
                *(undefined8 *)((long)pvVar2 + 0x10));
      }
      goto switchD_0017718e_caseD_4a;
    }
    break;
  case N_GOTO:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fprintf((FILE *)f,": target node %u\n",(ulong)*(uint *)((long)n->attr + 4));
    }
  case N_INDIRECT_GOTO:
    goto switchD_0017718e_caseD_4a;
  case N_LIST:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      print_decl_spec(c2m_ctx,f,(decl_spec *)n->attr);
    }
    break;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if ((attr_p != 0) && ((decl_t)n->attr != (decl_t)0x0)) {
      print_decl(c2m_ctx,f,(decl_t)n->attr);
    }
    break;
  case N_ENUM:
    if ((attr_p == 0) || (n->attr == (void *)0x0)) goto switchD_0017718e_caseD_4a;
    fwrite(": enum_basic_type = ",0x14,1,(FILE *)f);
    print_basic_type(f,*n->attr);
    break;
  case N_ENUM_CONST:
    if ((attr_p != 0) && ((undefined8 *)n->attr != (undefined8 *)0x0)) {
      fprintf((FILE *)f,": val = %lld\n",*n->attr);
    }
    goto switchD_0017718e_caseD_4a;
  case N_FUNC:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) goto switchD_0017718e_caseD_48;
    break;
  default:
    goto switchD_0017718e_default;
  }
  fputc(10,(FILE *)f);
switchD_0017718e_caseD_4a:
  print_ops(c2m_ctx,f,n,indent,attr_p);
  return;
}

Assistant:

static void print_node (c2m_ctx_t c2m_ctx, FILE *f, node_t n, int indent, int attr_p) {
  int i;

  fprintf (f, "%6u: ", n->uid);
  for (i = 0; i < indent; i++) fprintf (f, " ");
  if (n == err_node) {
    fprintf (f, "<error>\n");
    return;
  }
  fprintf (f, "%s (", get_node_name (n->code));
  print_pos (f, POS (n), FALSE);
  fprintf (f, ")");
  switch (n->code) {
  case N_IGNORE: fprintf (f, "\n"); break;
  case N_I: fprintf (f, " %lld", (long long) n->u.l); goto expr;
  case N_L: fprintf (f, " %lldl", (long long) n->u.l); goto expr;
  case N_LL: fprintf (f, " %lldll", (long long) n->u.ll); goto expr;
  case N_U: fprintf (f, " %lluu", (unsigned long long) n->u.ul); goto expr;
  case N_UL: fprintf (f, " %lluul", (unsigned long long) n->u.ul); goto expr;
  case N_ULL: fprintf (f, " %lluull", (unsigned long long) n->u.ull); goto expr;
  case N_F: fprintf (f, " %.*g", FLT_MANT_DIG, (double) n->u.f); goto expr;
  case N_D: fprintf (f, " %.*g", DBL_MANT_DIG, (double) n->u.d); goto expr;
  case N_LD: fprintf (f, " %.*Lg", LDBL_MANT_DIG, (long double) n->u.ld); goto expr;
  case N_CH:
  case N_CH16:
  case N_CH32:
    fprintf (f, " %s'", n->code == N_CH ? "" : n->code == N_CH16 ? "u" : "U");
    print_char (f, n->u.ch);
    fprintf (f, "'");
    goto expr;
  case N_STR:
  case N_STR16:
  case N_STR32:
    fprintf (f, " %s\"", n->code == N_STR ? "" : n->code == N_STR16 ? "u" : "U");
    (n->code == N_STR     ? print_chars
     : n->code == N_STR16 ? print_chars16
                          : print_chars32) (f, n->u.s.s, n->u.s.len);
    fprintf (f, "\"");
    goto expr;
  case N_ID:
    fprintf (f, " %s", n->u.s.s);
  expr:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    break;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_STMTEXPR:
  case N_LABEL_ADDR:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ATTR:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_LIST:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_decl_spec (c2m_ctx, f, (struct decl_spec *) n->attr);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if (attr_p && n->attr != NULL) print_decl (c2m_ctx, f, (decl_t) n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_FUNC:
    if (!attr_p || n->attr == NULL) {
      fprintf (f, "\n");
      print_ops (c2m_ctx, f, n, indent, attr_p);
      break;
    }
    /* fall through */
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
  case N_BLOCK:
  case N_FOR:
    if (!attr_p
        || ((n->code == N_STRUCT || n->code == N_UNION)
            && (NL_EL (n->u.ops, 1) == NULL || NL_EL (n->u.ops, 1)->code == N_IGNORE)))
      fprintf (f, "\n");
    else if (n->code == N_MODULE)
      fprintf (f, ": the top scope");
    else if (n->attr != NULL)
      fprintf (f, ": higher scope node %u", ((struct node_scope *) n->attr)->scope->uid);
    if (n->code == N_STRUCT || n->code == N_UNION)
      fprintf (f, "\n");
    else if (attr_p && n->attr != NULL)
      fprintf (f, ", size = %llu, offset = %llu\n",
               (unsigned long long) ((struct node_scope *) n->attr)->size,
               (unsigned long long) ((struct node_scope *) n->attr)->offset);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SWITCH:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_type (c2m_ctx, f, &((struct switch_attr *) n->attr)->type);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GOTO:
    if (attr_p && n->attr != NULL) fprintf (f, ": target node %u\n", ((node_t) n->attr)->uid);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_INDIRECT_GOTO: print_ops (c2m_ctx, f, n, indent, attr_p); break;
  case N_ENUM:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": enum_basic_type = ");
      print_basic_type (f, ((struct enum_type *) n->attr)->enum_basic_type);
      fprintf (f, "\n");
    }
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ENUM_CONST:
    if (attr_p && n->attr != NULL)  // ???!!!
      fprintf (f, ": val = %lld\n", (long long) ((struct enum_value *) n->attr)->u.i_val);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  default: abort ();
  }
}